

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.cpp
# Opt level: O2

int __thiscall asmjit::v1_14::FuncFrame::init(FuncFrame *this,EVP_PKEY_CTX *ctx)

{
  EVP_PKEY_CTX EVar1;
  EVP_PKEY_CTX EVar2;
  byte bVar3;
  RegMask RVar4;
  uint *puVar5;
  Iterator __begin2;
  RegGroup group_00;
  EVP_PKEY_CTX EVar6;
  RegGroup group;
  RegGroup local_41;
  byte *local_40;
  FuncFrame *local_38;
  
  EVar1 = *ctx;
  if ((byte)((char)EVar1 - 1U) < 0x10) {
    this->_attributes = kNoAttributes;
    this->_spRegId = 0xff;
    this->_saRegId = 0xff;
    *(undefined8 *)&this->_redZoneSize = 0;
    *(undefined8 *)((long)&this->_calleeStackCleanup + 1) = 0;
    *(undefined8 *)((long)&this->_localStackSize + 3) = 0;
    *(undefined8 *)((long)&this->_localStackOffset + 3) = 0;
    *(undefined8 *)((long)&this->_saOffsetFromSP + 3) = 0;
    *(undefined8 *)((long)&this->_stackAdjustment + 3) = 0;
    *(undefined8 *)((long)(this->_dirtyRegs)._data + 7) = 0;
    *(undefined8 *)((long)(this->_dirtyRegs)._data + 0xf) = 0;
    *(undefined8 *)((long)(this->_preservedRegs)._data + 7) = 0;
    *(undefined8 *)((long)(this->_preservedRegs)._data + 0xf) = 0;
    this->_saveRestoreAlignment = (uchar  [4])0x0;
    this->_pushPopSaveSize = 0;
    this->_extraRegSaveSize = 0;
    this->_pushPopSaveOffset = 0;
    this->_extraRegSaveOffset = 0;
    this->_arch = (Arch)EVar1;
    this->_spRegId = _archTraits[(ulong)(byte)EVar1 * 0xd8];
    this->_saRegId = 0xff;
    EVar2 = ctx[5];
    EVar6 = (EVP_PKEY_CTX)0x10;
    if (0x10 < (byte)EVar2) {
      EVar6 = EVar2;
    }
    this->_naturalStackAlignment = (uint8_t)EVar2;
    this->_minDynamicAlignment = (char)EVar6 << (0xf < (byte)EVar2);
    this->_redZoneSize = (uint8_t)ctx[3];
    this->_spillZoneSize = (uint8_t)ctx[4];
    this->_finalStackAlignment = (uint8_t)EVar2;
    if (((byte)ctx[8] & 1) != 0) {
      this->_calleeStackCleanup = *(uint16_t *)(ctx + 0x88);
    }
    local_40 = _archTraits + (ulong)(byte)EVar1 * 0xd8;
    local_38 = this;
    for (group_00 = k0; group_00 != kPC; group_00 = group_00 + kVec) {
      group = group_00;
      RVar4 = FuncDetail::usedRegs((FuncDetail *)ctx,group_00);
      puVar5 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                         (&this->_dirtyRegs,&group);
      *puVar5 = RVar4;
      RVar4 = CallConv::preservedRegs((CallConv *)ctx,group);
      puVar5 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                         (&this->_preservedRegs,&group);
      *puVar5 = RVar4;
    }
    bVar3 = *local_40;
    local_41 = k0;
    puVar5 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                       (&this->_preservedRegs,&local_41);
    *puVar5 = *puVar5 & (-2 << (bVar3 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar3 & 0x1f));
    *(undefined4 *)(local_38->_saveRestoreRegSize)._data = *(undefined4 *)(ctx + 0xc);
    *(undefined4 *)(local_38->_saveRestoreAlignment)._data = *(undefined4 *)(ctx + 0x10);
    return 0;
  }
  return 4;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FuncFrame::init(const FuncDetail& func) noexcept {
  Arch arch = func.callConv().arch();
  if (!Environment::isValidArch(arch))
    return DebugUtils::errored(kErrorInvalidArch);

  const ArchTraits& archTraits = ArchTraits::byArch(arch);

  // Initializing FuncFrame means making a copy of some properties of `func`. Properties like `_localStackSize` will
  // be set by the user before the frame is finalized.
  reset();

  _arch = arch;
  _spRegId = uint8_t(archTraits.spRegId());
  _saRegId = uint8_t(BaseReg::kIdBad);

  uint32_t naturalStackAlignment = func.callConv().naturalStackAlignment();
  uint32_t minDynamicAlignment = Support::max<uint32_t>(naturalStackAlignment, 16);

  if (minDynamicAlignment == naturalStackAlignment)
    minDynamicAlignment <<= 1;

  _naturalStackAlignment = uint8_t(naturalStackAlignment);
  _minDynamicAlignment = uint8_t(minDynamicAlignment);
  _redZoneSize = uint8_t(func.redZoneSize());
  _spillZoneSize = uint8_t(func.spillZoneSize());
  _finalStackAlignment = uint8_t(_naturalStackAlignment);

  if (func.hasFlag(CallConvFlags::kCalleePopsStack)) {
    _calleeStackCleanup = uint16_t(func.argStackSize());
  }

  // Initial masks of dirty and preserved registers.
  for (RegGroup group : RegGroupVirtValues{}) {
    _dirtyRegs[group] = func.usedRegs(group);
    _preservedRegs[group] = func.preservedRegs(group);
  }

  // Exclude stack pointer - this register is never included in saved GP regs.
  _preservedRegs[RegGroup::kGp] &= ~Support::bitMask(archTraits.spRegId());

  // The size and alignment of save/restore area of registers for each virtual register group
  _saveRestoreRegSize = func.callConv()._saveRestoreRegSize;
  _saveRestoreAlignment = func.callConv()._saveRestoreAlignment;

  return kErrorOk;
}